

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nlsol_ex_sol.h
# Opt level: O2

void __thiscall
ExampleSOLHandler::OnDblSuffix<mp::SuffixReader<double>>
          (ExampleSOLHandler *this,SuffixReader<double> *sr)

{
  ExampleModel *pEVar1;
  int iVar2;
  mapped_type *this_00;
  pointer pdVar3;
  pair<int,_double> pVar4;
  key_type local_48;
  
  iVar2 = (sr->si_).kind_;
  pEVar1 = this->mdl_;
  std::__cxx11::string::string((string *)&local_48,(string *)&(sr->si_).name_);
  local_48.second = iVar2;
  this_00 = std::
            map<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::vector<double,_std::allocator<double>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::vector<double,_std::allocator<double>_>_>_>_>
            ::operator[](&pEVar1->suf_out_,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  while ((sr->super_SparseVecReader<double>).n_ != 0) {
    pVar4 = mp::VecReader<std::pair<int,_double>_>::ReadNext(&sr->super_SparseVecReader<double>);
    pdVar3 = (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    iVar2 = pVar4.first;
    if ((ulong)((long)(this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_finish - (long)pdVar3 >> 3) <= (ulong)(long)iVar2)
    {
      std::vector<double,_std::allocator<double>_>::resize(this_00,(long)(iVar2 + 1));
      pdVar3 = (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
    }
    pdVar3[iVar2] = pVar4.second;
  }
  return;
}

Assistant:

void OnDblSuffix(SuffixReader& sr) {
    const auto& si = sr.SufInfo();
    int kind = si.Kind();
    const std::string& name = si.Name();
    assert(0 != (kind & 4));
    auto& suf_val = Model().suf_out_[std::make_pair(name, kind)];
    while (sr.Size()) {
      std::pair<int, double> val = sr.ReadNext();
      if (suf_val.size() <= val.first)
        suf_val.resize(val.first+1);
      suf_val[val.first] = val.second;
    }
  }